

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Glucose::Heap<Glucose::Solver::VarOrderLt>::percolateUp
          (Heap<Glucose::Solver::VarOrderLt> *this,int i)

{
  int index;
  int iVar1;
  int *piVar2;
  int in_ESI;
  long in_RDI;
  int p;
  int x;
  vec<int> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined1 local_21;
  undefined4 local_14;
  undefined4 local_c;
  
  piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),in_ESI);
  index = *piVar2;
  local_14 = parent(in_ESI);
  local_c = in_ESI;
  while( true ) {
    local_21 = false;
    if (local_c != 0) {
      vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_14);
      local_21 = Solver::VarOrderLt::operator()
                           ((VarOrderLt *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            (Var)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                            (Var)in_stack_ffffffffffffffc8);
    }
    if (local_21 == false) break;
    piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_14);
    iVar1 = *piVar2;
    piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_c);
    *piVar2 = iVar1;
    in_stack_ffffffffffffffc8 = (vec<int> *)(in_RDI + 0x18);
    piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_14);
    in_stack_ffffffffffffffd4 = local_c;
    piVar2 = vec<int>::operator[](in_stack_ffffffffffffffc8,*piVar2);
    *piVar2 = in_stack_ffffffffffffffd4;
    local_c = local_14;
    local_14 = parent(local_14);
  }
  piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_c);
  *piVar2 = index;
  piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x18),index);
  *piVar2 = local_c;
  return;
}

Assistant:

void percolateUp(int i)
    {
        int x  = heap[i];
        int p  = parent(i);
        
        while (i != 0 && lt(x, heap[p])){
            heap[i]          = heap[p];
            indices[heap[p]] = i;
            i                = p;
            p                = parent(p);
        }
        heap   [i] = x;
        indices[x] = i;
    }